

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O1

art_val_t * art_insert(art_t *art,art_key_chunk_t *key,art_val_t val)

{
  art_node_t *paVar1;
  uint64_t uVar2;
  art_ref_t new_leaf;
  ulong uVar3;
  
  uVar2 = art_allocate_index(art,'\x01');
  paVar1 = art->nodes[1];
  uVar3 = uVar2 * 0x10;
  *(undefined4 *)((long)paVar1 + uVar3) = *(undefined4 *)key;
  *(undefined2 *)((long)paVar1 + uVar3 + 4) = *(undefined2 *)(key + 4);
  *(art_val_t *)((long)paVar1 + uVar3 + 8) = val;
  new_leaf = uVar2 * 0x10000 + 1;
  if (art->root != 0) {
    new_leaf = art_insert_at(art,art->root,key,'\0',new_leaf);
  }
  art->root = new_leaf;
  return (art_val_t *)((long)art->nodes[1] + (uVar3 & 0xffffffffffff0) + 8);
}

Assistant:

art_val_t *art_insert(art_t *art, const art_key_chunk_t *key, art_val_t val) {
    art_ref_t leaf = art_leaf_create(art, key, val);
    if (art->root == CROARING_ART_NULL_REF) {
        art->root = leaf;
        return &((art_leaf_t *)art_deref(art, leaf))->val;
    }
    art->root = art_insert_at(art, art->root, key, 0, leaf);
    return &((art_leaf_t *)art_deref(art, leaf))->val;
}